

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

void __thiscall
JsUtil::
BaseDictionary<UnifiedRegex::RegexKey,_JsUtil::MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>::MruDictionaryData,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::Resize(BaseDictionary<UnifiedRegex::RegexKey,_JsUtil::MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>::MruDictionaryData,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
         *this)

{
  Type *pTVar1;
  int iVar2;
  Type TVar3;
  int *piVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  hash_t hashCode;
  long lVar9;
  uint uVar10;
  uint bucketCount;
  InternalString local_60;
  Type *local_50;
  uint local_44;
  Type local_40;
  int *newBuckets;
  EntryType *newEntries;
  
  uVar6 = this->count;
  uVar8 = uVar6 * 2;
  bucketCount = 4;
  if ((8 < uVar8) && (uVar10 = uVar6 & 0x7fffffff, bucketCount = uVar10, (uVar6 - 1 & uVar10) != 0))
  {
    iVar2 = 0x1f;
    if (uVar10 != 0) {
      for (; uVar10 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    bucketCount = 2;
    if (uVar10 != 1) {
      bucketCount = 1 << (-((byte)iVar2 ^ 0x1f) & 0x1f);
    }
  }
  local_40.ptr = (int *)0x0;
  newBuckets = (int *)0x0;
  pTVar1 = &this->entries;
  if (bucketCount == this->bucketCount) {
    newBuckets = (int *)AllocateEntries(this,uVar8,true);
    Memory::
    CopyArray<JsUtil::SimpleDictionaryEntry<UnifiedRegex::RegexKey,JsUtil::MruDictionary<UnifiedRegex::RegexKey,UnifiedRegex::RegexPattern*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry>::MruDictionaryData>,JsUtil::MruDictionary<UnifiedRegex::RegexKey,UnifiedRegex::RegexPattern*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry>::MruDictionaryData,Memory::RecyclerNonLeafAllocator>
              ((SimpleDictionaryEntry<UnifiedRegex::RegexKey,_JsUtil::MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>::MruDictionaryData>
                *)newBuckets,(long)(int)uVar8,(this->entries).ptr,(long)this->count);
    DeleteEntries(this,(this->entries).ptr,this->size);
    piVar4 = newBuckets;
    Memory::Recycler::WBSetBit((char *)pTVar1);
    (this->entries).ptr =
         (SimpleDictionaryEntry<UnifiedRegex::RegexKey,_JsUtil::MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>::MruDictionaryData>
          *)piVar4;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar1);
    this->size = uVar8;
    this->modFunctionIndex = 0x4b;
  }
  else {
    local_50 = pTVar1;
    local_44 = uVar8;
    Allocate(this,&local_40.ptr,(EntryType **)&newBuckets,bucketCount,uVar8);
    Memory::
    CopyArray<JsUtil::SimpleDictionaryEntry<UnifiedRegex::RegexKey,JsUtil::MruDictionary<UnifiedRegex::RegexKey,UnifiedRegex::RegexPattern*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry>::MruDictionaryData>,JsUtil::MruDictionary<UnifiedRegex::RegexKey,UnifiedRegex::RegexPattern*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry>::MruDictionaryData,Memory::RecyclerNonLeafAllocator>
              ((SimpleDictionaryEntry<UnifiedRegex::RegexKey,_JsUtil::MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>::MruDictionaryData>
                *)newBuckets,(long)(int)uVar8,(this->entries).ptr,(long)this->count);
    this->modFunctionIndex = 0x4b;
    if (0 < this->count) {
      lVar9 = 0;
      do {
        if (-2 < newBuckets[lVar9 * 10 + 4]) {
          Js::InternalString::InternalString
                    (&local_60,*(char16 **)(newBuckets + lVar9 * 10 + 6),newBuckets[lVar9 * 10 + 8],
                     '\0');
          if ((ulong)local_60.m_charLength == 0) {
            hashCode = 0x2393b8b;
          }
          else {
            uVar6 = 0x811c9dc5;
            uVar7 = 0;
            do {
              uVar8 = *(ushort *)
                       ((long)local_60.m_content.ptr +
                       uVar7 * 2 + (ulong)((uint)local_60.m_offset * 2)) ^ uVar6;
              uVar6 = uVar8 * 0x1000193;
              uVar7 = uVar7 + 1;
            } while (local_60.m_charLength != uVar7);
            hashCode = uVar8 * 0x2000326 + 1;
          }
          uVar5 = GetBucket(hashCode,bucketCount,this->modFunctionIndex);
          newBuckets[lVar9 * 10 + 4] = local_40.ptr[(int)uVar5];
          local_40.ptr[(int)uVar5] = (int)lVar9;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < this->count);
    }
    DeleteBuckets(this,(this->buckets).ptr,this->bucketCount);
    DeleteEntries(this,(this->entries).ptr,this->size);
    uVar6 = local_44;
    if (this->stats != (DictionaryStats *)0x0) {
      DictionaryStats::Resize(this->stats,local_44,local_44 - this->size);
    }
    TVar3.ptr = local_40.ptr;
    Memory::Recycler::WBSetBit((char *)this);
    (this->buckets).ptr = TVar3.ptr;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(this);
    piVar4 = newBuckets;
    pTVar1 = local_50;
    Memory::Recycler::WBSetBit((char *)local_50);
    (this->entries).ptr =
         (SimpleDictionaryEntry<UnifiedRegex::RegexKey,_JsUtil::MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>::MruDictionaryData>
          *)piVar4;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar1);
    this->bucketCount = bucketCount;
    this->size = uVar6;
  }
  return;
}

Assistant:

void Resize()
        {
            AutoDoResize autoDoResize(*this);

            int newSize = SizePolicy::GetNextSize(count);
            int modIndex = UNKNOWN_MOD_INDEX;
            uint newBucketCount = SizePolicy::GetBucketSize(newSize, &modIndex);

            __analysis_assume(newSize > count);
            int* newBuckets = nullptr;
            EntryType* newEntries = nullptr;
            if (newBucketCount == bucketCount)
            {
                // no need to rehash
                newEntries = AllocateEntries(newSize);
                CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                    newEntries, newSize, entries, count);

                DeleteEntries(entries, size);

                this->entries = newEntries;
                this->size = newSize;
                this->modFunctionIndex = modIndex;
                return;
            }

            Allocate(&newBuckets, &newEntries, newBucketCount, newSize);
            CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                newEntries, newSize, entries, count);

            // When TAllocator is of type Recycler, it is possible that the Allocate above causes a collection, which
            // in turn can cause entries in the dictionary to be removed - i.e. the dictionary contains weak references
            // that remove themselves when no longer valid. This means the free list might not be empty anymore.
            this->modFunctionIndex = modIndex;
            for (int i = 0; i < count; i++)
            {
                __analysis_assume(i < newSize);

                if (!IsFreeEntry(newEntries[i]))
                {
                    hash_t hashCode = newEntries[i].template GetHashCode<Comparer<TKey>>();
                    int bucket = GetBucket(hashCode, newBucketCount, modFunctionIndex);
                    newEntries[i].next = newBuckets[bucket];
                    newBuckets[bucket] = i;
                }
            }

            DeleteBuckets(buckets, bucketCount);
            DeleteEntries(entries, size);

#if PROFILE_DICTIONARY
            if (stats)
                stats->Resize(newSize, /*emptyBuckets=*/ newSize - size);
#endif
            this->buckets = newBuckets;
            this->entries = newEntries;
            bucketCount = newBucketCount;
            size = newSize;
        }